

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

char * upb_MtDataEncoder_PutBase92Varint
                 (upb_MtDataEncoder *e,char *ptr,uint32_t val,int min,int max)

{
  uint uVar1;
  byte bVar2;
  int8_t iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  
  iVar6 = -1;
  iVar4 = -1;
  if (0xa0 < (byte)((char)max + 0x81U)) {
    iVar4 = (int)""[(max & 0xffU) - 0x20];
  }
  bVar8 = (char)min + 0x81;
  if (0xa0 < bVar8) {
    iVar6 = (int)""[(min & 0xffU) - 0x20];
  }
  uVar5 = iVar4 - iVar6;
  uVar1 = 0x1f;
  if (uVar5 != 0) {
    for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  uVar7 = 0;
  if (0 < (int)uVar5) {
    uVar7 = (uVar1 ^ 0xffffffe0) + 0x21;
  }
  if (uVar7 < 7) {
    do {
      iVar3 = -1;
      if (0xa0 < bVar8) {
        iVar3 = ""[(min & 0xffU) - 0x20];
      }
      ptr = upb_MtDataEncoder_Put(e,ptr,((byte)val & ~(byte)(-1 << ((byte)uVar7 & 0x1f))) + iVar3);
      bVar2 = (byte)uVar7 & 0x1f;
    } while ((ptr != (char *)0x0) && (uVar1 = val >> bVar2, val = val >> bVar2, uVar1 != 0));
    return ptr;
  }
  __assert_fail("shift <= 6",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/mini_descriptor/internal/encode.c"
                ,0x45,
                "char *upb_MtDataEncoder_PutBase92Varint(upb_MtDataEncoder *, char *, uint32_t, int, int)"
               );
}

Assistant:

static char* upb_MtDataEncoder_PutBase92Varint(upb_MtDataEncoder* e, char* ptr,
                                               uint32_t val, int min, int max) {
  int shift = upb_Log2Ceiling(_upb_FromBase92(max) - _upb_FromBase92(min) + 1);
  UPB_ASSERT(shift <= 6);
  uint32_t mask = (1 << shift) - 1;
  do {
    uint32_t bits = val & mask;
    ptr = upb_MtDataEncoder_Put(e, ptr, bits + _upb_FromBase92(min));
    if (!ptr) return NULL;
    val >>= shift;
  } while (val);
  return ptr;
}